

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O3

void __thiscall
dg::dda::MemorySSATransformation::fillDefinitionsFromCall
          (MemorySSATransformation *this,Definitions *D,RWNodeCall *C)

{
  pointer pRVar1;
  RWNode *pRVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  int iVar6;
  mapped_type *si;
  _Rb_tree_node_base *p_Var7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer pRVar8;
  _Base_ptr p_Var9;
  const_iterator __begin6;
  _Hash_node_base *p_Var10;
  const_iterator __end6;
  DefSite local_48;
  
  p_Var5 = Offset::UNKNOWN;
  if (D->_processed == false) {
    pRVar8 = (C->callees).
             super__Vector_base<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pRVar1 = (C->callees).
             super__Vector_base<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pRVar8 != pRVar1) {
      p_Var4 = Offset::UNKNOWN + -1;
      do {
        pRVar2 = (RWNode *)pRVar8->subgraph;
        if (pRVar2 == (RWNode *)0x0) {
          pRVar2 = pRVar8->calledValue;
          iVar6 = (*pRVar2->_vptr_RWNode[2])();
          for (p_Var7 = *(_Rb_tree_node_base **)(CONCAT44(extraout_var,iVar6) + 0x18);
              p_Var7 != (_Rb_tree_node_base *)(CONCAT44(extraout_var,iVar6) + 8);
              p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
            fillDefinitionsFromCall(this,D,C,(DefSite *)(p_Var7 + 1));
          }
          iVar6 = (*pRVar2->_vptr_RWNode[2])();
          for (p_Var7 = *(_Rb_tree_node_base **)(CONCAT44(extraout_var_00,iVar6) + 0x48);
              p_Var7 != (_Rb_tree_node_base *)(CONCAT44(extraout_var_00,iVar6) + 0x38);
              p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
            fillDefinitionsFromCall(this,D,C,(DefSite *)(p_Var7 + 1));
          }
        }
        else {
          local_48.target = pRVar2;
          si = std::__detail::
               _Map_base<const_dg::dda::RWSubgraph_*,_std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_std::allocator<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::dda::RWSubgraph_*>,_std::hash<const_dg::dda::RWSubgraph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_dg::dda::RWSubgraph_*,_std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>,_std::allocator<std::pair<const_dg::dda::RWSubgraph_*const,_dg::dda::MemorySSATransformation::SubgraphInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_dg::dda::RWSubgraph_*>,_std::hash<const_dg::dda::RWSubgraph_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->_subgraphs_info,(key_type *)&local_48);
          computeModRef(this,(RWSubgraph *)pRVar2,si);
          for (p_Var10 = (si->modref).maydef._definitions._M_h._M_before_begin._M_nxt;
              p_Var10 != (_Hash_node_base *)0x0; p_Var10 = p_Var10->_M_nxt) {
            p_Var7 = (_Rb_tree_node_base *)p_Var10[5]._M_nxt;
            if ((_Hash_node_base *)UNKNOWN_MEMORY == p_Var10[1]._M_nxt) {
              for (; p_Var7 != (_Rb_tree_node_base *)(p_Var10 + 3);
                  p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
                std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
                _M_range_insert<std::_Rb_tree_const_iterator<dg::dda::RWNode*>>
                          ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)
                           &D->unknownWrites,
                           (D->unknownWrites).
                           super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,p_Var7[2]._M_parent,
                           &p_Var7[1]._M_right);
              }
            }
            else {
              for (; p_Var7 != (_Rb_tree_node_base *)(p_Var10 + 3);
                  p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
                local_48.offset.offset = *(type *)(p_Var7 + 1);
                p_Var3 = p_Var7[1]._M_parent;
                p_Var9 = p_Var5;
                if (p_Var3 != p_Var5) {
                  p_Var9 = (_Base_ptr)((long)p_Var3 - local_48.offset.offset);
                  if (p_Var3 < local_48.offset.offset) {
                    p_Var9 = p_Var5;
                  }
                  if ((_Base_ptr)local_48.offset.offset == p_Var5) {
                    p_Var9 = p_Var5;
                  }
                }
                local_48.len.offset = (type)((long)&p_Var9->_M_color + 1);
                if ((_Base_ptr)((long)&p_Var4->_M_right + 7U) <= p_Var9) {
                  local_48.len.offset = (type)p_Var5;
                }
                if (p_Var9 == p_Var5) {
                  local_48.len.offset = (type)p_Var5;
                }
                local_48.target = (RWNode *)p_Var10[1]._M_nxt;
                fillDefinitionsFromCall(this,D,C,&local_48);
              }
            }
          }
        }
        pRVar8 = pRVar8 + 1;
      } while (pRVar8 != pRVar1);
    }
    D->_processed = true;
  }
  return;
}

Assistant:

void MemorySSATransformation::fillDefinitionsFromCall(Definitions &D,
                                                      RWNodeCall *C) {
    if (D.isProcessed()) {
        return;
    }

    DBG_SECTION_BEGIN(dda, "Finding all definitions for a call " << C);

    for (auto &callee : C->getCallees()) {
        auto *subg = callee.getSubgraph();
        if (!subg) {
            auto *called = callee.getCalledValue();
            for (const auto &ds : called->getDefines()) {
                fillDefinitionsFromCall(D, C, ds);
            }
            for (const auto &ds : called->getOverwrites()) {
                fillDefinitionsFromCall(D, C, ds);
            }
        } else {
            auto &si = getSubgraphInfo(subg);
            computeModRef(subg, si);
            assert(si.modref.isInitialized());

            for (const auto &it : si.modref.maydef) {
                if (it.first->isUnknown()) {
                    for (const auto &it2 : it.second) {
                        D.unknownWrites.insert(D.unknownWrites.end(),
                                               it2.second.begin(),
                                               it2.second.end());
                    }
                    continue;
                }
                for (const auto &it2 : it.second) {
                    fillDefinitionsFromCall(
                            D, C,
                            {it.first, it2.first.start, it2.first.length()});
                }
            }
        }
    }

    DBG_SECTION_BEGIN(dda, "Finding all definitions for a call "
                                   << C << " finished");
    D.setProcessed();
}